

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O1

Gia_Man_t * Abc_NtkDeriveFlatGia2(Abc_Ntk_t *pNtk,Vec_Ptr_t *vModels)

{
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vOrder;
  Gia_Man_t *pGVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    pNtk_00 = (Abc_Ntk_t *)vModels->pArray[lVar2];
    vOrder = Abc_NtkDfsBoxes(pNtk_00);
    pGVar1 = Abc_NtkDeriveFlatGia2Derive(pNtk_00,vOrder);
    pNtk_00->pData = pGVar1;
    if (vOrder->pArray != (void **)0x0) {
      free(vOrder->pArray);
      vOrder->pArray = (void **)0x0;
    }
    if (vOrder != (Vec_Ptr_t *)0x0) {
      free(vOrder);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 < vModels->nSize);
  pGVar1 = (Gia_Man_t *)pNtk_00->pData;
  pNtk_00->pData = (void *)0x0;
  if (0 < vModels->nSize) {
    lVar2 = 0;
    do {
      Gia_ManStopP((Gia_Man_t **)((long)vModels->pArray[lVar2] + 0x158));
      lVar2 = lVar2 + 1;
    } while (lVar2 < vModels->nSize);
  }
  return pGVar1;
}

Assistant:

Gia_Man_t * Abc_NtkDeriveFlatGia2( Abc_Ntk_t * pNtk, Vec_Ptr_t * vModels )
{ 
    Vec_Ptr_t * vOrder;
    Abc_Ntk_t * pModel = NULL;
    Gia_Man_t * pGia = NULL;
    int i;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
    {
        vOrder = Abc_NtkDfsBoxes( pModel );
        pModel->pData = Abc_NtkDeriveFlatGia2Derive( pModel, vOrder );
        Vec_PtrFree( vOrder );
    }

    pGia = (Gia_Man_t *)pModel->pData;  pModel->pData = NULL;

    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pModel, i )
        Gia_ManStopP( (Gia_Man_t **)&pModel->pData );

    return pGia;
}